

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_pubkey *psVar1;
  int iVar2;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  ulong i;
  size_t heap_size;
  uchar *a;
  
  if (ctx != (secp256k1_context *)0x0) {
    if (pubkeys == (secp256k1_pubkey **)0x0) {
      (*(ctx->illegal_callback).fn)("pubkeys != NULL",(ctx->illegal_callback).data);
      iVar2 = 0;
    }
    else {
      i = n_pubkeys >> 1;
      while (i = i - 1, i != 0xffffffffffffffff) {
        secp256k1_heap_down((uchar *)pubkeys,i,n_pubkeys,(size_t)ctx,in_R8,in_R9);
      }
      iVar2 = 1;
      for (heap_size = n_pubkeys - 1; 1 < heap_size + 1; heap_size = heap_size - 1) {
        psVar1 = *pubkeys;
        *pubkeys = pubkeys[heap_size];
        pubkeys[heap_size] = psVar1;
        secp256k1_heap_down((uchar *)pubkeys,0,heap_size,(size_t)ctx,in_R8,in_R9);
      }
    }
    return iVar2;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/secp256k1.c"
          ,0x144,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ec_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    /* Casting away const is fine because neither secp256k1_hsort nor
     * secp256k1_ec_pubkey_sort_cmp modify the data pointed to by the cmp_data
     * argument. */
    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_ec_pubkey_sort_cmp, (void *)ctx);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}